

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stringpiece.cc
# Opt level: O0

size_type __thiscall
google::protobuf::stringpiece_internal::StringPiece::rfind(StringPiece *this,char c,size_type pos)

{
  bool bVar1;
  unsigned_long *puVar2;
  unsigned_long local_38;
  StringPiece *local_30;
  size_type i;
  size_type pos_local;
  StringPiece *pSStack_18;
  char c_local;
  StringPiece *this_local;
  
  i = pos;
  pos_local._7_1_ = c;
  pSStack_18 = this;
  bVar1 = empty(this);
  if (bVar1) {
    this_local = (StringPiece *)0xffffffffffffffff;
  }
  else {
    local_38 = this->length_ - 1;
    puVar2 = std::min<unsigned_long>(&i,&local_38);
    for (local_30 = (StringPiece *)*puVar2;
        *(char *)((long)&local_30->ptr_ + (long)this->ptr_) != pos_local._7_1_;
        local_30 = (StringPiece *)((long)&local_30[-1].length_ + 7)) {
      if (local_30 == (StringPiece *)0x0) {
        return 0xffffffffffffffff;
      }
    }
    this_local = local_30;
  }
  return (size_type)this_local;
}

Assistant:

StringPiece::size_type StringPiece::rfind(char c, size_type pos) const {
  // Note: memrchr() is not available on Windows.
  if (empty()) return npos;
  for (size_type i = std::min(pos, length_ - 1);; --i) {
    if (ptr_[i] == c) {
      return i;
    }
    if (i == 0) break;
  }
  return npos;
}